

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O2

ptrdiff_t rcnb_decode(wchar_t *code_in,size_t length_in,char *plaintext_out)

{
  ptrdiff_t pVar1;
  ptrdiff_t pVar2;
  ptrdiff_t pVar3;
  rcnb_decodestate es;
  
  if (length_in == 0) {
    return 0;
  }
  es.i = 0;
  pVar1 = rcnb_decode_block(code_in,length_in,plaintext_out,&es);
  if (pVar1 < 0) {
    pVar3 = -1;
  }
  else {
    pVar2 = rcnb_decode_blockend(plaintext_out + pVar1,&es);
    pVar3 = -1;
    if (-1 < pVar2) {
      pVar3 = pVar1 + pVar2;
    }
  }
  return pVar3;
}

Assistant:

ptrdiff_t rcnb_decode(const wchar_t* code_in, size_t length_in, char* plaintext_out)
{
    if (length_in == 0)
        return 0;
    rcnb_decodestate es;
    rcnb_init_decodestate(&es);
    size_t output_size = 0;
    ptrdiff_t block_size = 0;
    block_size = rcnb_decode_block(code_in, length_in, plaintext_out, &es);
    if (block_size < 0)
        return -1;
    output_size += block_size;
    block_size = rcnb_decode_blockend(plaintext_out + output_size, &es);
    if (block_size < 0)
        return -1;
    return output_size + block_size;
}